

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O2

Type * __thiscall
mnf::Manifold::getView<0,1>
          (Type *__return_storage_ptr__,Manifold *this,RefMat *val,size_t ir,size_t ic)

{
  Index startRow;
  Index startCol;
  Index blockRows;
  Index blockCols;
  
  startRow = getStart<0>(this,ir);
  startCol = getStart<1>(this,ic);
  blockRows = getDim<0>(this,ir);
  blockCols = getDim<1>(this,ic);
  Eigen::
  Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
  ::Block(__return_storage_ptr__,val,startRow,startCol,blockRows,blockCols);
  return __return_storage_ptr__;
}

Assistant:

inline typename ViewReturnType<Dr, Dc>::Type Manifold::getView(RefMat val,
                                                               size_t ir,
                                                               size_t ic) const
{
  return val.block(getStart<Dr>(ir), getStart<Dc>(ic), getDim<Dr>(ir),
                   getDim<Dc>(ic));
}